

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

Module * __thiscall wabt::Script::GetModule(Script *this,Var *var)

{
  pointer puVar1;
  __uniq_ptr_data<wabt::Command,_std::default_delete<wabt::Command>,_true,_true> _Var2;
  Index IVar3;
  Module *pMVar4;
  
  IVar3 = BindingHash::FindIndex(&this->module_bindings,var);
  puVar1 = (this->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)IVar3 <
      (ulong)((long)(this->commands).
                    super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    _Var2.super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl =
         puVar1[IVar3]._M_t.
         super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>;
    if (*(int *)((long)_Var2.
                       super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                       super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl + 8) != 0) {
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/cast.h"
                    ,0x4e,
                    "Derived *wabt::cast(Base *) [Derived = wabt::ModuleCommand, Base = wabt::Command]"
                   );
    }
    pMVar4 = (Module *)
             ((long)_Var2.super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl + 0x10);
  }
  else {
    pMVar4 = (Module *)0x0;
  }
  return pMVar4;
}

Assistant:

const Module* Script::GetModule(const Var& var) const {
  Index index = module_bindings.FindIndex(var);
  if (index >= commands.size()) {
    return nullptr;
  }
  auto* command = cast<ModuleCommand>(commands[index].get());
  return &command->module;
}